

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractListView<QImage>::resizeEvent(AbstractListView<QImage> *this,QResizeEvent *e)

{
  AbstractScrollAreaPrivate *pAVar1;
  int iVar2;
  QSize *pQVar3;
  QPoint *pQVar4;
  
  AbstractScrollArea::resizeEvent((AbstractScrollArea *)this,e);
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))(this)
  ;
  pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  if (pAVar1[1].q != (AbstractScrollArea *)0x0) {
    pQVar3 = AbstractScrollArea::scrolledAreaSize((AbstractScrollArea *)this);
    iVar2 = pQVar3->ht;
    pQVar4 = AbstractScrollArea::topLeftPointShownArea((AbstractScrollArea *)this);
    if (iVar2 - pQVar4->yp <=
        (*(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x20) -
        *(int *)(*(long *)(pAVar1->viewport + 0x20) + 0x18)) + 1) {
      iVar2 = (**(code **)(*(long *)pAVar1[1].q + 0x80))();
      scrollTo(this,iVar2 + -1,PositionAtBottom);
      return;
    }
  }
  return;
}

Assistant:

void resizeEvent( QResizeEvent * e ) override
	{
		AbstractListViewBase::resizeEvent( e );

		recalculateSize();

		AbstractListViewPrivate< T > * d = d_func();

		if( d->model &&
			scrolledAreaSize().height() - topLeftPointShownArea().y() <=
				d->viewport->height() )
				scrollTo( d->model->rowCount() - 1, PositionAtBottom );
	}